

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omplexer.cc
# Opt level: O3

void openmp__init_buffer(YY_BUFFER_STATE b,FILE *file)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  YY_BUFFER_STATE pyVar4;
  uint uVar5;
  
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  openmp__flush_buffer(b);
  b->yy_input_file = file;
  b->yy_fill_buffer = 1;
  if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
    pyVar4 = (YY_BUFFER_STATE)0x0;
  }
  else {
    pyVar4 = yy_buffer_stack[yy_buffer_stack_top];
  }
  if (pyVar4 != b) {
    b->yy_bs_lineno = 1;
    b->yy_bs_column = 0;
  }
  if (file == (FILE *)0x0) {
    uVar5 = 0;
  }
  else {
    iVar2 = fileno((FILE *)file);
    iVar2 = isatty(iVar2);
    uVar5 = (uint)(0 < iVar2);
  }
  b->yy_is_interactive = uVar5;
  *piVar3 = iVar1;
  return;
}

Assistant:

static void yy_init_buffer  (YY_BUFFER_STATE  b, FILE * file )

{
	int oerrno = errno;
    
	yy_flush_buffer( b );

	b->yy_input_file = file;
	b->yy_fill_buffer = 1;

    /* If b is the current buffer, then yy_init_buffer was _probably_
     * called from yyrestart() or through yy_get_next_buffer.
     * In that case, we don't want to reset the lineno or column.
     */
    if (b != YY_CURRENT_BUFFER){
        b->yy_bs_lineno = 1;
        b->yy_bs_column = 0;
    }

        b->yy_is_interactive = file ? (isatty( fileno(file) ) > 0) : 0;
    
	errno = oerrno;
}